

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutahedral_representation_iterators.h
# Opt level: O0

void __thiscall
Gudhi::coxeter_triangulation::
Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
::Face_iterator(Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                *this,Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      *simplex,uint *k)

{
  uint uVar1;
  size_t sVar2;
  Vertex *this_00;
  size_type __n;
  allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_71;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_70;
  allocator<int> local_51;
  vector<int,_std::allocator<int>_> local_50;
  uint local_34;
  uint local_30 [4];
  uint *local_20;
  uint *k_local;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *simplex_local;
  Face_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *this_local;
  
  local_20 = k;
  k_local = (uint *)simplex;
  simplex_local = &this->simplex_;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::Permutahedral_representation(&this->simplex_,simplex);
  this->k_ = *local_20;
  sVar2 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::dimension((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                       *)k_local);
  this->l_ = (uint)sVar2;
  local_30[0] = this->l_ + 1;
  local_34 = this->k_ + 1;
  Combination_iterator::Combination_iterator(&this->c_it_,local_30,&local_34);
  Combination_iterator::Combination_iterator(&this->c_end_);
  this->is_end_ = this->l_ < this->k_;
  this_00 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::vertex((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      *)k_local);
  __n = std::vector<int,_std::allocator<int>_>::size(this_00);
  std::allocator<int>::allocator(&local_51);
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__n,&local_51);
  uVar1 = *local_20;
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator(&local_71);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&local_70,(ulong)(uVar1 + 1),&local_71);
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::Permutahedral_representation(&this->value_,&local_50,&local_70);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_70);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator(&local_71)
  ;
  std::vector<int,_std::allocator<int>_>::~vector(&local_50);
  std::allocator<int>::~allocator(&local_51);
  update_value(this);
  return;
}

Assistant:

Face_iterator(const Permutahedral_representation& simplex, const uint& k)
      : simplex_(simplex),
        k_(k),
        l_(simplex.dimension()),
        c_it_(l_ + 1, k_ + 1),
        is_end_(k_ > l_),
        value_({Vertex(simplex.vertex().size()), Ordered_partition(k + 1)}) {
    update_value();
  }